

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O3

void __thiscall
PrimitiveObjectsWriter::WriteName
          (PrimitiveObjectsWriter *this,string *inName,ETokenSeparator inSeparate)

{
  byte bVar1;
  IByteWriter *pIVar2;
  long lVar3;
  size_t sVar4;
  byte *pbVar5;
  Byte buffer [5];
  byte local_35 [5];
  
  pIVar2 = this->mStreamForWriting;
  if (pIVar2 != (IByteWriter *)0x0) {
    (*pIVar2->_vptr_IByteWriter[2])(pIVar2,"/",1);
    if (inName->_M_string_length != 0) {
      pbVar5 = (byte *)(inName->_M_dataplus)._M_p;
      do {
        bVar1 = *pbVar5;
        if (((byte)(bVar1 + 0x81) < 0xa2) ||
           (lVar3 = std::__cxx11::string::find(-0x30,(ulong)(uint)(int)(char)bVar1), lVar3 != -1)) {
          sprintf((char *)local_35,"#%02x",(ulong)bVar1);
          pIVar2 = this->mStreamForWriting;
          sVar4 = strlen((char *)local_35);
          (*pIVar2->_vptr_IByteWriter[2])(pIVar2,local_35,sVar4);
        }
        else {
          local_35[0] = bVar1;
          (*this->mStreamForWriting->_vptr_IByteWriter[2])(this->mStreamForWriting,local_35,1);
        }
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != (byte *)((inName->_M_dataplus)._M_p + inName->_M_string_length));
    }
    WriteTokenSeparator(this,inSeparate);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteName(const std::string& inName,ETokenSeparator inSeparate)
{
/*
from the pdf reference:
This syntax is required to represent any of the delimiter or white-space characters or the number sign character itself; 
it is recommended but not required for characters whose codes are outside the range 33 (!) to 126 (~).
*/
	if(!mStreamForWriting)
		return;

	mStreamForWriting->Write(scSlash,1);

	IOBasicTypes::Byte buffer[5];
	std::string::const_iterator it = inName.begin();
	for(;it != inName.end();++it)
	{
		Byte aValue = *it;

		if(aValue < 33 || aValue > 126 || scSpecialChars.find(aValue) != scSpecialChars.npos)
		{
			SAFE_SPRINTF_1((char*)buffer,5,"#%02x",aValue); 
			mStreamForWriting->Write(buffer,strlen((char*)buffer));		
		}
		else
		{
			buffer[0] = aValue;
			mStreamForWriting->Write(buffer,1);
		}
	}

	WriteTokenSeparator(inSeparate);
}